

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

_glist * glist_finddirty(_glist *x)

{
  _glist *p_Var1;
  _glist *g2;
  t_gobj *g;
  _glist *x_local;
  
  g2 = (_glist *)x->gl_list;
  while( true ) {
    if (g2 == (_glist *)0x0) {
      if ((x->gl_env == (_canvasenvironment *)0x0) ||
         (x_local = x, (*(ushort *)&x->field_0xe8 >> 2 & 1) == 0)) {
        x_local = (_glist *)0x0;
      }
      return x_local;
    }
    if (((g2->gl_obj).te_g.g_pd == canvas_class) &&
       (p_Var1 = glist_finddirty(g2), p_Var1 != (_glist *)0x0)) break;
    g2 = (_glist *)(g2->gl_obj).te_g.g_next;
  }
  return p_Var1;
}

Assistant:

static t_glist *glist_finddirty(t_glist *x)
{
    t_gobj *g;
    t_glist *g2;
    for (g = x->gl_list; g; g = g->g_next)
        if (pd_class(&g->g_pd) == canvas_class &&
            (g2 = glist_finddirty((t_glist *)g)))
                return (g2);

    if (x->gl_env && x->gl_dirty)
        return (x);
    else
        return (0);
}